

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c
# Opt level: O2

_Bool duckdb_je_malloc_mutex_init
                (malloc_mutex_t *mutex,char *name,witness_rank_t rank,
                malloc_mutex_lock_order_t lock_order)

{
  int iVar1;
  _Bool _Var2;
  pthread_mutexattr_t attr;
  pthread_mutexattr_t local_1c;
  
  mutex_prof_data_init((mutex_prof_data_t *)mutex);
  iVar1 = pthread_mutexattr_init(&local_1c);
  _Var2 = true;
  if (iVar1 == 0) {
    pthread_mutexattr_settype(&local_1c,0);
    iVar1 = pthread_mutex_init((pthread_mutex_t *)((long)&mutex->field_0 + 0x48),&local_1c);
    _Var2 = iVar1 != 0;
    pthread_mutexattr_destroy(&local_1c);
  }
  return _Var2;
}

Assistant:

bool
malloc_mutex_init(malloc_mutex_t *mutex, const char *name,
    witness_rank_t rank, malloc_mutex_lock_order_t lock_order) {
	mutex_prof_data_init(&mutex->prof_data);
#ifdef _WIN32
#  if _WIN32_WINNT >= 0x0600
	InitializeSRWLock(&mutex->lock);
#  else
	if (!InitializeCriticalSectionAndSpinCount(&mutex->lock,
	    _CRT_SPINCOUNT)) {
		return true;
	}
#  endif
#elif (defined(JEMALLOC_OS_UNFAIR_LOCK))
       mutex->lock = OS_UNFAIR_LOCK_INIT;
#elif (defined(JEMALLOC_MUTEX_INIT_CB))
	if (postpone_init) {
		mutex->postponed_next = postponed_mutexes;
		postponed_mutexes = mutex;
	} else {
		if (_pthread_mutex_init_calloc_cb(&mutex->lock,
		    bootstrap_calloc) != 0) {
			return true;
		}
	}
#else
	pthread_mutexattr_t attr;

	if (pthread_mutexattr_init(&attr) != 0) {
		return true;
	}
	pthread_mutexattr_settype(&attr, MALLOC_MUTEX_TYPE);
	if (pthread_mutex_init(&mutex->lock, &attr) != 0) {
		pthread_mutexattr_destroy(&attr);
		return true;
	}
	pthread_mutexattr_destroy(&attr);
#endif
	if (config_debug) {
		mutex->lock_order = lock_order;
		if (lock_order == malloc_mutex_address_ordered) {
			witness_init(&mutex->witness, name, rank,
			    mutex_addr_comp, mutex);
		} else {
			witness_init(&mutex->witness, name, rank, NULL, NULL);
		}
	}
	return false;
}